

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::WriteDeviceLinkRule
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *output)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  cmLocalUnixMakefileGenerator3 *this_01;
  cmGeneratedFileStream *pcVar5;
  bool bVar6;
  TargetType targetType;
  string *psVar7;
  string *psVar8;
  pointer pbVar9;
  long *plVar10;
  pointer pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer pbVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view value;
  string_view separator;
  string fatbinaryOutput;
  string objectDir;
  allocator_type local_389;
  string linkFlags;
  string compileCmd;
  string flags;
  string architecturesStr;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  _Alloc_node __an;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string fatbinaryOutputRel;
  string fatbinaryCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDeps;
  string profiles;
  RuleVariables vars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fatbinaryDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string local_b0;
  string relObjectDir;
  cmList architectures;
  string registerFile;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  vars.CMTargetName = (char *)&vars.TargetPDB;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"CUDA_ARCHITECTURES","");
  psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,(string *)&vars);
  architecturesStr._M_dataplus._M_p = (pointer)&architecturesStr.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&architecturesStr,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((char **)vars.CMTargetName != &vars.TargetPDB) {
    operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
  }
  value._M_str = architecturesStr._M_dataplus._M_p;
  value._M_len = architecturesStr._M_string_length;
  bVar6 = cmValue::IsOff(value);
  if (bVar6) {
    pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
    vars.CMTargetName = (char *)&vars.TargetPDB;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&vars,
               "CUDA_SEPARABLE_COMPILATION on Clang requires CUDA_ARCHITECTURES to be set.","");
    cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,(string *)&vars);
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
  }
  else {
    this_01 = this->LocalGenerator;
    vars.CMTargetName = (char *)&vars.TargetPDB;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vars,architecturesStr._M_dataplus._M_p,
               architecturesStr._M_dataplus._M_p + architecturesStr._M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)&vars;
    cmList::cmList(&architectures,init);
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
    psVar7 = cmLocalUnixMakefileGenerator3::GetHomeRelativeOutputPath_abi_cxx11_(this_01);
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AppendTargetDepends(this,&linkDeps,true);
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_((string *)&vars,this);
    objectDir.field_2._M_allocated_capacity._0_4_ = 0x41445543;
    objectDir._M_string_length = 4;
    objectDir.field_2._M_allocated_capacity._4_4_ =
         objectDir.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    objectDir._M_dataplus._M_p = (pointer)&objectDir.field_2;
    cmGeneratorTarget::GetLinkDepends(pcVar2,&linkDeps,(string *)&vars,&objectDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
      operator_delete(objectDir._M_dataplus._M_p,
                      CONCAT44(objectDir.field_2._M_allocated_capacity._4_4_,
                               objectDir.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
    pbVar9 = (this->Objects).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (this->Objects).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar9 != pbVar11) {
      do {
        vars.CMTargetType = (psVar7->_M_dataplus)._M_p;
        vars.CMTargetName = (char *)psVar7->_M_string_length;
        vars.TargetPDB = (char *)0x0;
        vars.TargetVersionMajor = (pbVar9->_M_dataplus)._M_p;
        vars.TargetCompilePDB = (char *)pbVar9->_M_string_length;
        vars.TargetVersionMinor = (char *)0x0;
        views._M_len = 2;
        views._M_array = (iterator)&vars;
        cmCatViews(&objectDir,views);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkDeps,
                   &objectDir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
          operator_delete(objectDir._M_dataplus._M_p,
                          CONCAT44(objectDir.field_2._M_allocated_capacity._4_4_,
                                   objectDir.field_2._M_allocated_capacity._0_4_) + 1);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar11);
    }
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&vars,linkDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               linkDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,0,&objectDir,&relObjectDir,&profiles);
    pbVar11 = linkDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar9 = linkDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (linkDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        linkDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar12 = &(linkDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar10 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (paVar12 + -1))->_M_dataplus)._M_p;
        if (paVar12 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar10) {
          operator_delete(plVar10,paVar12->_M_allocated_capacity + 1);
        }
        pbVar13 = (pointer)(paVar12 + 1);
        paVar12 = paVar12 + 2;
      } while (pbVar13 != pbVar11);
      linkDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
    }
    if (vars.TargetPDB != (char *)0x0) {
      plVar10 = (long *)vars.TargetPDB;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&linkDeps,(value_type *)(plVar10 + 1));
        plVar10 = (long *)*plVar10;
      } while (plVar10 != (long *)0x0);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&vars);
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar3 = (pcVar2->ObjectDirectory)._M_dataplus._M_p;
    objectDir._M_dataplus._M_p = (pointer)&objectDir.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&objectDir,pcVar3,pcVar3 + (pcVar2->ObjectDirectory)._M_string_length);
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&relObjectDir,(cmOutputConverter *)this_01,&objectDir);
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmOutputConverter::MaybeRelativeToCurBinDir((string *)&vars,(cmOutputConverter *)this_01,output)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cleanFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
    profiles._M_dataplus._M_p = (pointer)&profiles.field_2;
    profiles._M_string_length = 0;
    profiles.field_2._M_local_buf[0] = '\0';
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vars.CMTargetName = (char *)objectDir._M_string_length;
    vars.CMTargetType = objectDir._M_dataplus._M_p;
    vars.TargetPDB = (char *)0x0;
    vars.TargetCompilePDB = (char *)0x15;
    vars.TargetVersionMajor = "cmake_cuda_register.h";
    vars.TargetVersionMinor = (char *)0x0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&vars;
    cmCatViews(&registerFile,views_00);
    if (architectures.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        architectures.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar9 = architectures.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        fatbinaryCommand._M_dataplus._M_p = (pointer)&fatbinaryCommand.field_2;
        fatbinaryCommand._M_string_length = 0;
        fatbinaryCommand.field_2._M_local_buf[0] = '\0';
        if (fatbinaryDepends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            fatbinaryDepends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          vars.CMTargetType = (psVar7->_M_dataplus)._M_p;
          vars.CMTargetName = (char *)psVar7->_M_string_length;
          vars.TargetPDB = (char *)0x0;
          vars.TargetCompilePDB = (char *)relObjectDir._M_string_length;
          vars.TargetVersionMajor = relObjectDir._M_dataplus._M_p;
          vars.TargetVersionMinor = (char *)0x0;
          vars.Language = (char *)0x15;
          vars.AIXExports = "cmake_cuda_register.h";
          vars.Objects = (char *)0x0;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&vars;
          cmCatViews(&fatbinaryOutput,views_01);
          vars.CMTargetName = (char *)0x1a;
          vars.CMTargetType = " --register-link-binaries=";
          vars.TargetPDB = (char *)0x0;
          vars.TargetCompilePDB = (char *)fatbinaryOutput._M_string_length;
          vars.TargetVersionMajor = fatbinaryOutput._M_dataplus._M_p;
          vars.TargetVersionMinor = (char *)0x0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&vars;
          cmCatViews(&fatbinaryOutputRel,views_02);
          std::__cxx11::string::operator=((string *)&fatbinaryCommand,(string *)&fatbinaryOutputRel)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fatbinaryOutputRel._M_dataplus._M_p != &fatbinaryOutputRel.field_2) {
            operator_delete(fatbinaryOutputRel._M_dataplus._M_p,
                            fatbinaryOutputRel.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&cleanFiles,&fatbinaryOutput);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
            operator_delete(fatbinaryOutput._M_dataplus._M_p,
                            fatbinaryOutput.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::find((char)pbVar9,0x2d);
        std::__cxx11::string::substr((ulong)&fatbinaryOutput,(ulong)pbVar9);
        vars.CMTargetName = (char *)objectDir._M_string_length;
        vars.CMTargetType = objectDir._M_dataplus._M_p;
        vars.TargetPDB = (char *)0x0;
        vars.TargetCompilePDB = (char *)0x3;
        vars.TargetVersionMajor = "sm_";
        vars.TargetVersionMinor = (char *)0x0;
        vars.Language = (char *)fatbinaryOutput._M_string_length;
        vars.AIXExports = fatbinaryOutput._M_dataplus._M_p;
        vars.Objects = (char *)0x0;
        vars.Target = (char *)0x6;
        vars.LinkLibraries = ".cubin";
        vars.Source = (char *)0x0;
        views_03._M_len = 4;
        views_03._M_array = (iterator)&vars;
        cmCatViews(&fatbinaryOutputRel,views_03);
        vars.CMTargetName = (char *)0x10;
        vars.CMTargetType = " -im=profile=sm_";
        vars.TargetPDB = (char *)0x0;
        vars.TargetCompilePDB = (char *)fatbinaryOutput._M_string_length;
        vars.TargetVersionMajor = fatbinaryOutput._M_dataplus._M_p;
        vars.TargetVersionMinor = (char *)0x0;
        vars.Language = (char *)0x6;
        vars.AIXExports = ",file=";
        vars.Objects = (char *)0x0;
        vars.Target = (char *)fatbinaryOutputRel._M_string_length;
        vars.LinkLibraries = fatbinaryOutputRel._M_dataplus._M_p;
        vars.Source = (char *)0x0;
        views_04._M_len = 4;
        views_04._M_array = (iterator)&vars;
        cmCatViews(&linkFlags,views_04);
        std::__cxx11::string::_M_append((char *)&profiles,(ulong)linkFlags._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
          operator_delete(linkFlags._M_dataplus._M_p,
                          CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                   linkFlags.field_2._M_local_buf[0]) + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &fatbinaryDepends,&fatbinaryOutputRel);
        pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
        flags._M_dataplus._M_p = (pointer)&flags.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&flags,"CMAKE_CUDA_DEVICE_LINKER","");
        psVar8 = cmMakefile::GetRequiredDefinition(pcVar4,&flags);
        separator._M_str = " ";
        separator._M_len = 1;
        cmJoin(&compileCmd,&linkDeps,separator,(string_view)ZEXT816(0));
        vars.CMTargetType = (psVar8->_M_dataplus)._M_p;
        vars.CMTargetName = (char *)psVar8->_M_string_length;
        vars.TargetPDB = (char *)0x0;
        vars.TargetCompilePDB = (char *)0xa;
        vars.TargetVersionMajor = " -arch=sm_";
        vars.TargetVersionMinor = (char *)0x0;
        vars.Language = (char *)fatbinaryOutput._M_string_length;
        vars.AIXExports = fatbinaryOutput._M_dataplus._M_p;
        vars.Objects = (char *)0x0;
        vars.Target = (char *)fatbinaryCommand._M_string_length;
        vars.LinkLibraries = fatbinaryCommand._M_dataplus._M_p;
        vars.Source = (char *)0x0;
        vars.AssemblySource = (char *)0x7;
        vars.PreprocessedSource = " -o=$@ ";
        vars.DynDepFile = (char *)0x0;
        vars.Output = (char *)compileCmd._M_string_length;
        vars.Object = compileCmd._M_dataplus._M_p;
        views_05._M_len = 6;
        views_05._M_array = (iterator)&vars;
        vars.ObjectDir = (char *)&compileCmd;
        cmCatViews(&linkFlags,views_05);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)compileCmd._M_dataplus._M_p != &compileCmd.field_2) {
          operator_delete(compileCmd._M_dataplus._M_p,compileCmd.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)flags._M_dataplus._M_p != &flags.field_2) {
          operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = (this->BuildFileStream)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
        vars.CMTargetName = (char *)&vars.TargetPDB;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&vars,linkFlags._M_dataplus._M_p,
                   linkFlags._M_dataplus._M_p + linkFlags._M_string_length);
        __l._M_len = 1;
        __l._M_array = (iterator)&vars;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&flags,__l,(allocator_type *)&compileCmd);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (this_01,(ostream *)pcVar5,(char *)0x0,&fatbinaryOutputRel,&linkDeps,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&flags,false,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&flags);
        if ((char **)vars.CMTargetName != &vars.TargetPDB) {
          operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
          operator_delete(linkFlags._M_dataplus._M_p,
                          CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                   linkFlags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fatbinaryOutputRel._M_dataplus._M_p != &fatbinaryOutputRel.field_2) {
          operator_delete(fatbinaryOutputRel._M_dataplus._M_p,
                          fatbinaryOutputRel.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
          operator_delete(fatbinaryOutput._M_dataplus._M_p,
                          fatbinaryOutput.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fatbinaryCommand._M_dataplus._M_p != &fatbinaryCommand.field_2) {
          operator_delete(fatbinaryCommand._M_dataplus._M_p,
                          CONCAT71(fatbinaryCommand.field_2._M_allocated_capacity._1_7_,
                                   fatbinaryCommand.field_2._M_local_buf[0]) + 1);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != architectures.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
    fatbinaryOutput._M_dataplus._M_p = (pointer)&fatbinaryOutput.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fatbinaryOutput,"CMAKE_CUDA_FATBINARY","");
    psVar8 = cmMakefile::GetRequiredDefinition(pcVar4,&fatbinaryOutput);
    vars.CMTargetType = (psVar8->_M_dataplus)._M_p;
    vars.CMTargetName = (char *)psVar8->_M_string_length;
    vars.TargetPDB = (char *)0x0;
    vars.TargetCompilePDB = (char *)0x45;
    vars.TargetVersionMajor =
         " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$@";
    vars.TargetVersionMinor = (char *)0x0;
    vars.Language = (char *)profiles._M_string_length;
    vars.AIXExports = profiles._M_dataplus._M_p;
    vars.Objects = (char *)0x0;
    views_06._M_len = 3;
    views_06._M_array = (iterator)&vars;
    cmCatViews(&fatbinaryCommand,views_06);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
      operator_delete(fatbinaryOutput._M_dataplus._M_p,
                      fatbinaryOutput.field_2._M_allocated_capacity + 1);
    }
    vars.CMTargetName = (char *)objectDir._M_string_length;
    vars.CMTargetType = objectDir._M_dataplus._M_p;
    vars.TargetPDB = (char *)0x0;
    vars.TargetCompilePDB = (char *)0x13;
    vars.TargetVersionMajor = "cmake_cuda_fatbin.h";
    vars.TargetVersionMinor = (char *)0x0;
    views_07._M_len = 2;
    views_07._M_array = (iterator)&vars;
    cmCatViews(&fatbinaryOutput,views_07);
    vars.CMTargetType = (psVar7->_M_dataplus)._M_p;
    vars.CMTargetName = (char *)psVar7->_M_string_length;
    vars.TargetPDB = (char *)0x0;
    vars.TargetCompilePDB = (char *)relObjectDir._M_string_length;
    vars.TargetVersionMajor = relObjectDir._M_dataplus._M_p;
    vars.TargetVersionMinor = (char *)0x0;
    vars.Language = (char *)0x13;
    vars.AIXExports = "cmake_cuda_fatbin.h";
    vars.Objects = (char *)0x0;
    views_08._M_len = 3;
    views_08._M_array = (iterator)&vars;
    cmCatViews(&fatbinaryOutputRel,views_08);
    pcVar5 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    vars.CMTargetName = (char *)&vars.TargetPDB;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vars,fatbinaryCommand._M_dataplus._M_p,
               fatbinaryCommand._M_dataplus._M_p + fatbinaryCommand._M_string_length);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&vars;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&linkFlags,__l_00,(allocator_type *)&flags);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_01,(ostream *)pcVar5,(char *)0x0,&fatbinaryOutputRel,&fatbinaryDepends,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&linkFlags,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&linkFlags);
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
    memset(&vars,0,0x158);
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    vars.CMTargetName = (psVar7->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    psVar7 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    vars.CMTargetType = (psVar7->_M_dataplus)._M_p;
    vars.Language = "CUDA";
    vars.Object = (output->_M_dataplus)._M_p;
    vars.Fatbinary = fatbinaryOutput._M_dataplus._M_p;
    vars.RegisterFile = registerFile._M_dataplus._M_p;
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    paVar12 = &flags.field_2;
    flags._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&flags,"CUDA","");
    GetDeviceLinkFlags(this,&linkFlags,&flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)flags._M_dataplus._M_p != paVar12) {
      operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
    }
    vars.LinkFlags = linkFlags._M_dataplus._M_p;
    paVar1 = &compileCmd.field_2;
    compileCmd._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&compileCmd,"CUDA","");
    GetConfigName_abi_cxx11_((string *)&__an,this);
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    cmCommonTargetGenerator::GetFlags
              (&flags,&this->super_cmCommonTargetGenerator,&compileCmd,(string *)&__an,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__an._M_t != &local_2e8) {
      operator_delete(__an._M_t,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compileCmd._M_dataplus._M_p != paVar1) {
      operator_delete(compileCmd._M_dataplus._M_p,compileCmd.field_2._M_allocated_capacity + 1);
    }
    vars.Flags = flags._M_dataplus._M_p;
    __an._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__an,"CMAKE_CUDA_DEVICE_LINK_COMPILE","");
    GetLinkRule(&compileCmd,this,(string *)&__an);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__an._M_t != &local_2e8) {
      operator_delete(__an._M_t,local_2e8._M_allocated_capacity + 1);
    }
    (*(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[6])(&rulePlaceholderExpander,this_01);
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)
               rulePlaceholderExpander._M_t.
               super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
               .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
               (cmOutputConverter *)this_01,&compileCmd,&vars);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
               &compileCmd);
    pcVar5 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    __an._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__an,fatbinaryOutputRel._M_dataplus._M_p,
               fatbinaryOutputRel._M_dataplus._M_p + fatbinaryOutputRel._M_string_length);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&__an;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_b0,__l_01,&local_389);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_01,(ostream *)pcVar5,(char *)0x0,output,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_b0,commands,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__an._M_t != &local_2e8) {
      operator_delete(__an._M_t,local_2e8._M_allocated_capacity + 1);
    }
    pbVar9 = cleanFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = &this->CleanFiles;
    __an._M_t = &this_00->_M_t;
    if (cleanFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        cleanFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar11 = cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,(const_iterator)&(this->CleanFiles)._M_t._M_impl.super__Rb_tree_header
                   ,pbVar11,&__an);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != pbVar9);
    }
    if ((__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
        )rulePlaceholderExpander._M_t.
         super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
         .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
        )0x0) {
      (**(code **)(*(long *)rulePlaceholderExpander._M_t.
                            super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                            .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl
                  + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compileCmd._M_dataplus._M_p != paVar1) {
      operator_delete(compileCmd._M_dataplus._M_p,compileCmd.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)flags._M_dataplus._M_p != paVar12) {
      operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
      operator_delete(linkFlags._M_dataplus._M_p,
                      CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                               linkFlags.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryOutputRel._M_dataplus._M_p != &fatbinaryOutputRel.field_2) {
      operator_delete(fatbinaryOutputRel._M_dataplus._M_p,
                      fatbinaryOutputRel.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
      operator_delete(fatbinaryOutput._M_dataplus._M_p,
                      fatbinaryOutput.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryCommand._M_dataplus._M_p != &fatbinaryCommand.field_2) {
      operator_delete(fatbinaryCommand._M_dataplus._M_p,
                      CONCAT71(fatbinaryCommand.field_2._M_allocated_capacity._1_7_,
                               fatbinaryCommand.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)registerFile._M_dataplus._M_p != &registerFile.field_2) {
      operator_delete(registerFile._M_dataplus._M_p,registerFile.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fatbinaryDepends);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)profiles._M_dataplus._M_p != &profiles.field_2) {
      operator_delete(profiles._M_dataplus._M_p,
                      CONCAT71(profiles.field_2._M_allocated_capacity._1_7_,
                               profiles.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cleanFiles);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)relObjectDir._M_dataplus._M_p != &relObjectDir.field_2) {
      operator_delete(relObjectDir._M_dataplus._M_p,relObjectDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
      operator_delete(objectDir._M_dataplus._M_p,
                      CONCAT44(objectDir.field_2._M_allocated_capacity._4_4_,
                               objectDir.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&architectures.Values);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)architecturesStr._M_dataplus._M_p != &architecturesStr.field_2) {
    operator_delete(architecturesStr._M_dataplus._M_p,
                    architecturesStr.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteDeviceLinkRule(
  std::vector<std::string>& commands, const std::string& output)
{
  std::string architecturesStr =
    this->GeneratorTarget->GetSafeProperty("CUDA_ARCHITECTURES");

  if (cmIsOff(architecturesStr)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "CUDA_SEPARABLE_COMPILATION on Clang "
                                 "requires CUDA_ARCHITECTURES to be set.");
    return;
  }

  cmLocalUnixMakefileGenerator3* localGen{ this->LocalGenerator };
  cmList architectures{ architecturesStr };
  std::string const& relPath = localGen->GetHomeRelativeOutputPath();

  // Ensure there are no duplicates.
  const std::vector<std::string> linkDeps = [&]() -> std::vector<std::string> {
    std::vector<std::string> deps;
    this->AppendTargetDepends(deps, true);
    this->GeneratorTarget->GetLinkDepends(deps, this->GetConfigName(), "CUDA");

    for (std::string const& obj : this->Objects) {
      deps.emplace_back(cmStrCat(relPath, obj));
    }

    std::unordered_set<std::string> const depsSet(deps.begin(), deps.end());
    deps.clear();
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  const std::string objectDir = this->GeneratorTarget->ObjectDirectory;
  const std::string relObjectDir =
    localGen->MaybeRelativeToCurBinDir(objectDir);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> cleanFiles;
  cleanFiles.push_back(localGen->MaybeRelativeToCurBinDir(output));

  std::string profiles;
  std::vector<std::string> fatbinaryDepends;
  std::string const registerFile =
    cmStrCat(objectDir, "cmake_cuda_register.h");

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    std::string registerFileCmd;

    // The generated register file contains macros that when expanded
    // register the device routines. Because the routines are the same for
    // all architectures the register file will be the same too. Thus
    // generate it only on the first invocation to reduce overhead.
    if (fatbinaryDepends.empty()) {
      std::string const registerFileRel =
        cmStrCat(relPath, relObjectDir, "cmake_cuda_register.h");
      registerFileCmd =
        cmStrCat(" --register-link-binaries=", registerFileRel);
      cleanFiles.push_back(registerFileRel);
    }

    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(objectDir, "sm_", architecture, ".cubin");

    profiles += cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinaryDepends.emplace_back(cubin);

    std::string command = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
      " -arch=sm_", architecture, registerFileCmd, " -o=$@ ",
      cmJoin(linkDeps, " "));

    localGen->WriteMakeRule(*this->BuildFileStream, nullptr, cubin, linkDeps,
                            { command }, false);
  }

  // Combine all architectures into a single fatbinary.
  const std::string fatbinaryCommand =
    cmStrCat(this->Makefile->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
             " -64 -cmdline=--compile-only -compress-all -link "
             "--embedded-fatbin=$@",
             profiles);
  const std::string fatbinaryOutput =
    cmStrCat(objectDir, "cmake_cuda_fatbin.h");
  const std::string fatbinaryOutputRel =
    cmStrCat(relPath, relObjectDir, "cmake_cuda_fatbin.h");

  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, fatbinaryOutputRel,
                          fatbinaryDepends, { fatbinaryCommand }, false);

  // Compile the stub that registers the kernels and contains the
  // fatbinaries.
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = output.c_str();
  vars.Fatbinary = fatbinaryOutput.c_str();
  vars.RegisterFile = registerFile.c_str();

  std::string linkFlags;
  this->GetDeviceLinkFlags(linkFlags, "CUDA");
  vars.LinkFlags = linkFlags.c_str();

  std::string const flags = this->GetFlags("CUDA", this->GetConfigName());
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetLinkRule("CMAKE_CUDA_DEVICE_LINK_COMPILE");
  auto rulePlaceholderExpander = localGen->CreateRulePlaceholderExpander();
  rulePlaceholderExpander->ExpandRuleVariables(localGen, compileCmd, vars);

  commands.emplace_back(compileCmd);
  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, output,
                          { fatbinaryOutputRel }, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(cleanFiles.begin(), cleanFiles.end());
}